

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vfscanf.c
# Opt level: O2

int vfscanf(FILE *__s,char *__format,__gnuc_va_list __arg)

{
  char **mtx;
  byte bVar1;
  int iVar2;
  int iVar3;
  uint __c;
  byte *pbVar4;
  _PDCLIB_status_t local_88;
  
  local_88.s = (char *)0x0;
  local_88.width = 0;
  local_88.i = 0;
  local_88.current = 0;
  local_88.base = 0;
  local_88.flags = 0;
  local_88.n = 0;
  local_88.prec = -1;
  mtx = &__s->_IO_save_base;
  local_88.stream = (_PDCLIB_file_t *)__s;
  mtx_lock((mtx_t *)mtx);
  iVar2 = _PDCLIB_prepread((_PDCLIB_file_t *)__s);
  if ((iVar2 == -1) ||
     (((__s->_IO_read_base == __s->_IO_write_base && (__s->_IO_buf_base == (char *)0x0)) &&
      (iVar2 = _PDCLIB_fillbuffer((_PDCLIB_file_t *)__s), iVar2 == -1)))) {
LAB_00105385:
    mtx_unlock((mtx_t *)mtx);
    local_88.n._0_4_ = -1;
  }
  else {
    local_88.arg[0].reg_save_area = *(void **)((long)__arg + 0x10);
    local_88.arg[0]._0_8_ = *__arg;
    local_88.arg[0].overflow_arg_area = *(void **)((long)__arg + 8);
    do {
      for (; bVar1 = *__format, bVar1 != 0x25; __format = (char *)((byte *)__format + 1)) {
        if (bVar1 == 0) goto LAB_0010539c;
LAB_001052fa:
        iVar2 = isspace((uint)bVar1);
        if (iVar2 == 0) {
          iVar2 = getc(__s);
          if ((iVar2 != *__format) || (iVar3 = feof(__s), iVar3 != 0)) {
            iVar3 = feof(__s);
            if ((iVar3 == 0) && (iVar3 = ferror(__s), iVar3 == 0)) {
              ungetc(iVar2,__s);
            }
            else if (local_88.n == 0) goto LAB_00105385;
            goto LAB_0010539c;
          }
          local_88.i = local_88.i + 1;
        }
        else {
          while( true ) {
            __c = getc(__s);
            iVar2 = isspace(__c & 0xff);
            if (iVar2 == 0) break;
            local_88.i = local_88.i + 1;
          }
          iVar2 = feof(__s);
          if (iVar2 == 0) {
            ungetc(__c,__s);
          }
        }
      }
      pbVar4 = (byte *)_PDCLIB_scan(__format,&local_88);
      if (pbVar4 == (byte *)__format) {
        bVar1 = *__format;
        goto LAB_001052fa;
      }
      __format = (char *)pbVar4;
    } while (pbVar4 != (byte *)0x0);
LAB_0010539c:
    mtx_unlock((mtx_t *)mtx);
  }
  return (int)local_88.n;
}

Assistant:

int vfscanf( FILE * _PDCLIB_restrict stream, const char * _PDCLIB_restrict format, va_list arg )
{
    /* TODO: This function should interpret format as multibyte characters.  */
    struct _PDCLIB_status_t status;
    status.base = 0;
    status.flags = 0;
    status.n = 0;
    status.i = 0;
    status.current = 0;
    status.s = NULL;
    status.width = 0;
    status.prec = EOF;
    status.stream = stream;

    _PDCLIB_LOCK( stream->mtx );

    if ( _PDCLIB_prepread( stream ) == EOF || _PDCLIB_CHECKBUFFER( stream ) == EOF )
    {
        _PDCLIB_UNLOCK( stream->mtx );
        return EOF;
    }

    va_copy( status.arg, arg );

    while ( *format != '\0' )
    {
        const char * rc;

        if ( ( *format != '%' ) || ( ( rc = _PDCLIB_scan( format, &status ) ) == format ) )
        {
            int c;

            /* No conversion specifier, match verbatim */
            if ( isspace( (unsigned char)*format ) )
            {
                /* Whitespace char in format string: Skip all whitespaces */
                /* No whitespaces in input does not result in matching error */
                while ( isspace( (unsigned char)( c = getc( stream ) ) ) )
                {
                    ++status.i;
                }

                if ( ! feof( stream ) )
                {
                    ungetc( c, stream );
                }
            }
            else
            {
                /* Non-whitespace char in format string: Match verbatim */
                if ( ( ( c = getc( stream ) ) != *format ) || feof( stream ) )
                {
                    /* Matching error */
                    if ( ! feof( stream ) && ! ferror( stream ) )
                    {
                        ungetc( c, stream );
                    }
                    else if ( status.n == 0 )
                    {
                        _PDCLIB_UNLOCK( stream->mtx );
                        return EOF;
                    }

                    _PDCLIB_UNLOCK( stream->mtx );
                    return status.n;
                }
                else
                {
                    ++status.i;
                }
            }

            ++format;
        }
        else
        {
            /* NULL return code indicates matching error */
            if ( rc == NULL )
            {
                break;
            }

            /* Continue parsing after conversion specifier */
            format = rc;
        }
    }

    va_end( status.arg );
    _PDCLIB_UNLOCK( stream->mtx );
    return status.n;
}